

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapetriang.cpp
# Opt level: O3

void pzshape::TPZShapeTriang::ShapeInternal
               (int side,TPZVec<double> *x,int order,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi)

{
  long *plVar1;
  
  if (side - 7U < 0xfffffffc) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapetriang.cpp"
               ,0x164);
  }
  if (side - 3U < 3) {
    TPZShapeLinear::ShapeInternal(x,order,phi,dphi);
    return;
  }
  if (side == 6) {
    ShapeInternal(x,order,phi,dphi);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "static void pzshape::TPZShapeTriang::ShapeInternal(int, TPZVec<REAL> &, int, TPZFMatrix<REAL> &, TPZFMatrix<REAL> &)"
             ,0x74);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," Wrong side parameter side ",0x1b);
  plVar1 = (long *)std::ostream::operator<<(&std::cout,side);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapetriang.cpp"
             ,0x178);
}

Assistant:

void TPZShapeTriang::ShapeInternal(int side, TPZVec<REAL> &x, int order,
                                     TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi) {
        if (side < 3 || side > 6) {
            DebugStop();
        }
        
        switch (side) {
                
            case 3:
            case 4:
            case 5:
            {
                pzshape::TPZShapeLinear::ShapeInternal(x, order, phi, dphi);
            }
                break;
            case 6:
            {
                
                ShapeInternal(x, order, phi, dphi);
            }
                break;
            default:
                std::cout << __PRETTY_FUNCTION__ << " Wrong side parameter side " << side << std::endl;
                DebugStop();
                break;
        }
      
        
        
    }